

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICMakeFiles.cxx
# Opt level: O0

Value * __thiscall
anon_unknown.dwarf_1166dda::CMakeFiles::DumpPaths(Value *__return_storage_ptr__,CMakeFiles *this)

{
  Value *pVVar1;
  Value local_80;
  Value local_48;
  undefined1 local_19;
  CMakeFiles *local_18;
  CMakeFiles *this_local;
  Value *paths;
  
  local_19 = 0;
  local_18 = this;
  this_local = (CMakeFiles *)__return_storage_ptr__;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  Json::Value::Value(&local_48,this->TopSource);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"source");
  Json::Value::operator=(pVVar1,&local_48);
  Json::Value::~Value(&local_48);
  Json::Value::Value(&local_80,this->TopBuild);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"build");
  Json::Value::operator=(pVVar1,&local_80);
  Json::Value::~Value(&local_80);
  return __return_storage_ptr__;
}

Assistant:

Json::Value CMakeFiles::DumpPaths()
{
  Json::Value paths = Json::objectValue;
  paths["source"] = this->TopSource;
  paths["build"] = this->TopBuild;
  return paths;
}